

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Light.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Lighting_SpotLight(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  long *plVar10;
  long *plVar11;
  aiVector3D *pValue;
  string *psVar12;
  int pAttrIdx;
  ulong uVar13;
  float fVar14;
  CX3DImporter_NodeElement *ne;
  aiColor3D color;
  aiVector3D location;
  aiVector3D direction;
  aiVector3D attenuation;
  string use;
  string def;
  string an;
  bool local_27a;
  bool local_279;
  CX3DImporter_NodeElement *local_278;
  float local_270;
  float local_26c;
  float local_268;
  float local_264;
  float local_260;
  uint local_25c;
  aiColor3D local_258;
  CX3DImporter_NodeElement *local_24c;
  float local_244;
  pointer local_240;
  float local_238;
  aiVector3D local_234;
  string local_228;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_234.x = 1.0;
  local_234.y = 0.0;
  local_234.z = 0.0;
  local_258.r = 1.0;
  local_258.g = 1.0;
  local_258.b = 1.0;
  local_240 = (pointer)0x0;
  local_238 = -1.0;
  local_24c = (CX3DImporter_NodeElement *)0x0;
  local_244 = 0.0;
  local_278 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    local_260 = 0.0;
    local_270 = 100.0;
    local_27a = true;
    local_26c = 1.0;
    local_268 = 1.570796;
    local_264 = 0.7854;
    local_279 = true;
  }
  else {
    local_264 = 0.7854;
    local_268 = 1.570796;
    local_26c = 1.0;
    local_279 = true;
    local_270 = 100.0;
    uVar13 = 0;
    local_260 = 0.0;
    local_27a = true;
    local_25c = uVar7;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar13;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,(char *)CONCAT44(extraout_var,iVar8),
                 (allocator<char> *)&local_1c8);
      iVar8 = std::__cxx11::string::compare((char *)local_1a8);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar12 = &local_208;
LAB_006465c3:
        pcVar3 = (char *)psVar12->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar3,(ulong)__s);
        uVar7 = local_25c;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)local_1a8);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar12 = &local_228;
          goto LAB_006465c3;
        }
        iVar8 = std::__cxx11::string::compare((char *)local_1a8);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)local_1a8), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)local_1a8), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)local_1a8);
          if (iVar8 == 0) {
            local_260 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)local_1a8);
            pValue = &local_234;
            if (iVar8 == 0) goto LAB_0064662f;
            iVar8 = std::__cxx11::string::compare((char *)local_1a8);
            if (iVar8 == 0) {
              local_264 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)local_1a8);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsCol3f(this,pAttrIdx,&local_258);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                if (iVar8 == 0) {
                  local_268 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                  pValue = (aiVector3D *)&local_240;
                  if (iVar8 == 0) {
LAB_0064662f:
                    XML_ReadNode_GetAttrVal_AsVec3f(this,pAttrIdx,pValue);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                    if (iVar8 == 0) {
                      local_27a = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                      if (iVar8 == 0) {
                        local_26c = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                        pValue = (aiVector3D *)&local_24c;
                        if (iVar8 == 0) goto LAB_0064662f;
                        iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                        if (iVar8 == 0) {
                          local_279 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)local_1a8);
                          if (iVar8 == 0) {
                            local_270 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                          }
                          else {
                            Throw_IncorrectAttr(this,local_1a8);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar13 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
  }
  if (local_228._M_string_length == 0) {
    if (local_279 == false) goto LAB_00646ae4;
    local_278 = (CX3DImporter_NodeElement *)operator_new(0x98);
    pCVar4 = this->NodeElement_Cur;
    local_278->Type = ENET_SpotLight;
    (local_278->ID)._M_dataplus._M_p = (pointer)&(local_278->ID).field_2;
    (local_278->ID)._M_string_length = 0;
    (local_278->ID).field_2._M_local_buf[0] = '\0';
    local_278->Parent = pCVar4;
    (local_278->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_278->Child;
    (local_278->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_278->Child;
    (local_278->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_278->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_008f46e0;
    *(undefined8 *)((long)&local_278[1]._vptr_CX3DImporter_NodeElement + 4) = 0;
    *(undefined8 *)&local_278[1].field_0xc = 0;
    *(undefined8 *)((long)&local_278[1].ID._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&local_278[1].ID.field_2 + 4) = 0;
    *(undefined8 *)((long)&local_278[1].ID.field_2 + 0xc) = 0;
    *(undefined8 *)((long)&local_278[1].Parent + 4) = 0;
    if (local_208._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_278->ID);
    }
    fVar14 = local_268;
    if (local_264 <= local_268) {
      fVar14 = local_264;
    }
    *(float *)&local_278[1]._vptr_CX3DImporter_NodeElement = local_260;
    *(undefined8 *)((long)&local_278[1].ID.field_2 + 4) = local_234._0_8_;
    *(float *)((long)&local_278[1].ID.field_2 + 0xc) = local_234.z;
    *(float *)&local_278[1].Child.
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev = fVar14;
    *(ai_real *)((long)&local_278[1]._vptr_CX3DImporter_NodeElement + 4) = local_258.r;
    local_278[1].Type = (EType)local_258.g;
    *(ai_real *)&local_278[1].field_0xc = local_258.b;
    *(float *)((long)&local_278[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 4) = local_268;
    local_278[1].ID._M_dataplus._M_p = local_240;
    *(float *)&local_278[1].ID._M_string_length = local_238;
    *(bool *)((long)&local_278[1].ID._M_string_length + 4) = local_27a;
    *(float *)&local_278[1].ID.field_2 = local_26c;
    local_278[1].Parent = local_24c;
    *(float *)&local_278[1].Child.
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node.super__List_node_base._M_next = local_244;
    *(float *)((long)&local_278[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next + 4) = local_270;
    ParseHelper_Group_Begin(this,false);
    if ((local_278->ID)._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x714605);
      plVar11 = plVar10 + 2;
      if ((long *)*plVar10 == plVar11) {
        local_1b8 = *plVar11;
        lStack_1b0 = plVar10[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar11;
        local_1c8 = (long *)*plVar10;
      }
      local_1c0 = plVar10[1];
      *plVar10 = (long)plVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_278->ID,(string *)&local_1c8);
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
    }
    std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
    ParseHelper_Node_Exit(this);
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_278;
    if ((char)iVar8 == '\0') {
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SpotLight","");
      ParseNode_Metadata(this,pCVar4,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)local_278;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_278;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_208._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_228,ENET_SpotLight,&local_278);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_228);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_278;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_00646ae4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Lighting_SpotLight()
{
    std::string def, use;
    float ambientIntensity = 0;
    aiVector3D attenuation( 1, 0, 0 );
    float beamWidth = 0.7854f;
    aiColor3D color( 1, 1, 1 );
    float cutOffAngle = 1.570796f;
    aiVector3D direction( 0, 0, -1 );
    bool global = true;
    float intensity = 1;
    aiVector3D location( 0, 0, 0 );
    bool on = true;
    float radius = 100;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("attenuation", attenuation, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("beamWidth", beamWidth, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("color", color, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_RET("cutOffAngle", cutOffAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("direction", direction, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("global", global, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("intensity", intensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("location", location, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("on", on, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_SpotLight, ne);
	}
	else
	{
		if(on)
		{
			// create and if needed - define new geometry object.
			ne = new CX3DImporter_NodeElement_Light(CX3DImporter_NodeElement::ENET_SpotLight, NodeElement_Cur);
			if(!def.empty()) ne->ID = def;

			if(beamWidth > cutOffAngle) beamWidth = cutOffAngle;

			((CX3DImporter_NodeElement_Light*)ne)->AmbientIntensity = ambientIntensity;
			((CX3DImporter_NodeElement_Light*)ne)->Attenuation = attenuation;
			((CX3DImporter_NodeElement_Light*)ne)->BeamWidth = beamWidth;
			((CX3DImporter_NodeElement_Light*)ne)->Color = color;
			((CX3DImporter_NodeElement_Light*)ne)->CutOffAngle = cutOffAngle;
			((CX3DImporter_NodeElement_Light*)ne)->Direction = direction;
			((CX3DImporter_NodeElement_Light*)ne)->Global = global;
			((CX3DImporter_NodeElement_Light*)ne)->Intensity = intensity;
			((CX3DImporter_NodeElement_Light*)ne)->Location = location;
			((CX3DImporter_NodeElement_Light*)ne)->Radius = radius;

			// Assimp want a node with name similar to a light. "Why? I don't no." )
			ParseHelper_Group_Begin(false);
			// make random name
			if(ne->ID.empty()) ne->ID = "SpotLight_" + to_string((size_t)ne);

			NodeElement_Cur->ID = ne->ID;// assign name to node and return to light element.
			ParseHelper_Node_Exit();
			// check for child nodes
			if(!mReader->isEmptyElement())
				ParseNode_Metadata(ne, "SpotLight");
			else
				NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

			NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
		}// if(on)
	}// if(!use.empty()) else
}